

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_is_prime_ext
              (mbedtls_mpi *X,int rounds,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_50 [8];
  mbedtls_mpi XX;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  int rounds_local;
  mbedtls_mpi *X_local;
  
  XX.p._4_4_ = 0xffffff92;
  local_50._0_4_ = 1;
  XX._0_8_ = X->n;
  XX.n = (size_t)X->p;
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_50,0);
  if ((iVar1 == 0) || (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_50,1), iVar1 == 0)) {
    X_local._4_4_ = -0xe;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_50,2);
    if (iVar1 == 0) {
      X_local._4_4_ = 0;
    }
    else {
      XX.p._4_4_ = mpi_check_small_factors((mbedtls_mpi *)local_50);
      if (XX.p._4_4_ == 0) {
        X_local._4_4_ = mpi_miller_rabin((mbedtls_mpi *)local_50,(long)rounds,f_rng,p_rng);
      }
      else {
        X_local._4_4_ = XX.p._4_4_;
        if (XX.p._4_4_ == 1) {
          X_local._4_4_ = 0;
        }
      }
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_is_prime_ext( const mbedtls_mpi *X, int rounds,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi XX;
    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    XX.s = 1;
    XX.n = X->n;
    XX.p = X->p;

    if( mbedtls_mpi_cmp_int( &XX, 0 ) == 0 ||
        mbedtls_mpi_cmp_int( &XX, 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    if( mbedtls_mpi_cmp_int( &XX, 2 ) == 0 )
        return( 0 );

    if( ( ret = mpi_check_small_factors( &XX ) ) != 0 )
    {
        if( ret == 1 )
            return( 0 );

        return( ret );
    }

    return( mpi_miller_rabin( &XX, rounds, f_rng, p_rng ) );
}